

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *args_3;
  SystemTimingCheckSyntax *pSVar1;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::TimingCheckArgSyntax>
                     ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)(__fn + 0x70),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0xb8),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SystemTimingCheckSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,&local_50,args_3,&local_60,
                      &local_70);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SystemTimingCheckSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SystemTimingCheckSyntax>(
        *deepClone(node.attributes, alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.args, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}